

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O3

convertCaffeLayerFn *
caffeLayerRegistry(convertCaffeLayerFn *__return_storage_ptr__,string *layerType)

{
  const_iterator cVar1;
  convertCaffeLayerFn *extraout_RAX;
  ostream *poVar2;
  runtime_error *this;
  long lVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
  CAFFE_LAYER_REGISTRY;
  stringstream ss;
  undefined1 local_d52;
  undefined1 local_d51;
  string *local_d50;
  string local_d48 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d28;
  ostream *local_cf0 [2];
  ostream local_ce0 [16];
  code *local_cd0;
  undefined8 local_cc8;
  code *local_cc0;
  code *local_cb8;
  undefined1 *local_cb0 [2];
  undefined1 local_ca0 [16];
  code *local_c90;
  undefined8 local_c88;
  code *local_c80;
  code *local_c78;
  undefined1 *local_c70 [2];
  undefined1 local_c60 [16];
  code *local_c50;
  undefined8 local_c48;
  code *local_c40;
  code *local_c38;
  undefined1 *local_c30 [2];
  undefined1 local_c20 [16];
  code *local_c10;
  undefined8 local_c08;
  code *local_c00;
  code *local_bf8;
  undefined1 *local_bf0 [2];
  undefined1 local_be0 [16];
  code *local_bd0;
  undefined8 local_bc8;
  code *local_bc0;
  code *local_bb8;
  undefined1 *local_bb0 [2];
  undefined1 local_ba0 [16];
  code *local_b90;
  undefined8 local_b88;
  code *local_b80;
  code *local_b78;
  undefined1 *local_b70 [2];
  undefined1 local_b60 [16];
  code *local_b50;
  undefined8 local_b48;
  code *local_b40;
  code *local_b38;
  undefined1 *local_b30 [2];
  undefined1 local_b20 [16];
  code *local_b10;
  undefined8 local_b08;
  code *local_b00;
  code *local_af8;
  undefined1 *local_af0 [2];
  undefined1 local_ae0 [16];
  code *local_ad0;
  undefined8 local_ac8;
  code *local_ac0;
  code *local_ab8;
  undefined1 *local_ab0 [2];
  undefined1 local_aa0 [16];
  code *local_a90;
  undefined8 local_a88;
  code *local_a80;
  code *local_a78;
  undefined1 *local_a70 [2];
  undefined1 local_a60 [16];
  code *local_a50;
  undefined8 local_a48;
  code *local_a40;
  code *local_a38;
  undefined1 *local_a30 [2];
  undefined1 local_a20 [16];
  code *local_a10;
  undefined8 local_a08;
  code *local_a00;
  code *local_9f8;
  undefined1 *local_9f0 [2];
  undefined1 local_9e0 [16];
  code *local_9d0;
  undefined8 local_9c8;
  code *local_9c0;
  code *local_9b8;
  undefined1 *local_9b0 [2];
  undefined1 local_9a0 [16];
  code *local_990;
  undefined8 local_988;
  code *local_980;
  code *local_978;
  undefined1 *local_970 [2];
  undefined1 local_960 [16];
  code *local_950;
  undefined8 local_948;
  code *local_940;
  code *local_938;
  undefined1 *local_930 [2];
  undefined1 local_920 [16];
  code *local_910;
  undefined8 local_908;
  code *local_900;
  code *local_8f8;
  undefined1 *local_8f0 [2];
  undefined1 local_8e0 [16];
  code *local_8d0;
  undefined8 local_8c8;
  code *local_8c0;
  code *local_8b8;
  undefined1 *local_8b0 [2];
  undefined1 local_8a0 [16];
  code *local_890;
  undefined8 local_888;
  code *local_880;
  code *local_878;
  undefined1 *local_870 [2];
  undefined1 local_860 [16];
  code *local_850;
  undefined8 local_848;
  code *local_840;
  code *local_838;
  undefined1 *local_830 [2];
  undefined1 local_820 [16];
  code *local_810;
  undefined8 local_808;
  code *local_800;
  code *local_7f8;
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  code *local_7d0;
  undefined8 local_7c8;
  code *local_7c0;
  code *local_7b8;
  undefined1 *local_7b0 [2];
  undefined1 local_7a0 [16];
  code *local_790;
  undefined8 local_788;
  code *local_780;
  code *local_778;
  undefined1 *local_770 [2];
  undefined1 local_760 [16];
  code *local_750;
  undefined8 local_748;
  code *local_740;
  code *local_738;
  undefined1 *local_730 [2];
  undefined1 local_720 [16];
  code *local_710;
  undefined8 local_708;
  code *local_700;
  code *local_6f8;
  undefined1 *local_6f0 [2];
  undefined1 local_6e0 [16];
  code *local_6d0;
  undefined8 local_6c8;
  code *local_6c0;
  code *local_6b8;
  undefined1 *local_6b0 [2];
  undefined1 local_6a0 [16];
  code *local_690;
  undefined8 local_688;
  code *local_680;
  code *local_678;
  undefined1 *local_670 [2];
  undefined1 local_660 [16];
  code *local_650;
  undefined8 local_648;
  code *local_640;
  code *local_638;
  undefined1 *local_630 [2];
  undefined1 local_620 [16];
  code *local_610;
  undefined8 local_608;
  code *local_600;
  code *local_5f8;
  undefined1 *local_5f0 [2];
  undefined1 local_5e0 [16];
  code *local_5d0;
  undefined8 local_5c8;
  code *local_5c0;
  code *local_5b8;
  undefined1 *local_5b0 [2];
  undefined1 local_5a0 [16];
  code *local_590;
  undefined8 local_588;
  code *local_580;
  code *local_578;
  undefined1 *local_570 [2];
  undefined1 local_560 [16];
  code *local_550;
  undefined8 local_548;
  code *local_540;
  code *local_538;
  undefined1 *local_530 [2];
  undefined1 local_520 [16];
  code *local_510;
  undefined8 local_508;
  code *local_500;
  code *local_4f8;
  undefined1 *local_4f0 [2];
  undefined1 local_4e0 [16];
  code *local_4d0;
  undefined8 local_4c8;
  code *local_4c0;
  code *local_4b8;
  undefined1 *local_4b0 [2];
  undefined1 local_4a0 [16];
  code *local_490;
  undefined8 local_488;
  code *local_480;
  code *local_478;
  undefined1 *local_470 [2];
  undefined1 local_460 [16];
  code *local_450;
  undefined8 local_448;
  code *local_440;
  code *local_438;
  undefined1 *local_430 [2];
  undefined1 local_420 [16];
  code *local_410;
  undefined8 local_408;
  code *local_400;
  code *local_3f8;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  code *local_3d0;
  undefined8 local_3c8;
  code *local_3c0;
  code *local_3b8;
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  code *local_390;
  undefined8 local_388;
  code *local_380;
  code *local_378;
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  code *local_350;
  undefined8 local_348;
  code *local_340;
  code *local_338;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  code *local_310;
  undefined8 local_308;
  code *local_300;
  code *local_2f8;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  code *local_2d0;
  undefined8 local_2c8;
  code *local_2c0;
  code *local_2b8;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  code *local_290;
  undefined8 local_288;
  code *local_280;
  code *local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  code *local_250;
  undefined8 local_248;
  code *local_240;
  code *local_238;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  code *local_210;
  undefined8 local_208;
  code *local_200;
  code *local_1f8;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  code *local_1d0;
  undefined8 local_1c8;
  code *local_1c0;
  code *local_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  code *local_190;
  undefined8 local_188;
  code *local_180;
  code *local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  code *local_150;
  undefined8 local_148;
  code *local_140;
  code *local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  code *local_110;
  undefined8 local_108;
  code *local_100;
  code *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  code *local_d0;
  undefined8 local_c8;
  code *local_c0;
  code *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  code *local_90;
  undefined8 local_88;
  code *local_80;
  code *local_78;
  long *local_70 [2];
  long local_60 [2];
  code *local_50;
  undefined8 local_48;
  code *local_40 [2];
  
  local_cf0[0] = local_ce0;
  local_d50 = layerType;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cf0,"ReLU","");
  local_cc8 = 0;
  local_cd0 = CoreMLConverter::convertCaffeActivation;
  local_cb8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_cc0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_cb0[0] = local_ca0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cb0,"BNLL","");
  local_c88 = 0;
  local_c90 = CoreMLConverter::convertCaffeActivation;
  local_c78 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_c80 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_c70[0] = local_c60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c70,"PReLU","");
  local_c48 = 0;
  local_c50 = CoreMLConverter::convertCaffeActivation;
  local_c38 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_c40 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_c30[0] = local_c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"ELU","");
  local_c08 = 0;
  local_c10 = CoreMLConverter::convertCaffeActivation;
  local_bf8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_c00 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_bf0[0] = local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"Sigmoid","");
  local_bc8 = 0;
  local_bd0 = CoreMLConverter::convertCaffeActivation;
  local_bb8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_bc0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_bb0[0] = local_ba0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bb0,"TanH","");
  local_b88 = 0;
  local_b90 = CoreMLConverter::convertCaffeActivation;
  local_b78 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_b80 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_b70[0] = local_b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"Parameter","");
  local_b48 = 0;
  local_b50 = CoreMLConverter::convertCaffeParameter;
  local_b38 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_b40 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_b30[0] = local_b20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b30,"InnerProduct","");
  local_b08 = 0;
  local_b10 = CoreMLConverter::convertCaffeInnnerProduct;
  local_af8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_b00 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_af0[0] = local_ae0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_af0,"Convolution","");
  local_ac8 = 0;
  local_ad0 = CoreMLConverter::convertCaffeConvolution;
  local_ab8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_ac0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_ab0[0] = local_aa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ab0,"Deconvolution","");
  local_a88 = 0;
  local_a90 = CoreMLConverter::convertCaffeConvolution;
  local_a78 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_a80 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_a70[0] = local_a60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a70,"LRN","");
  local_a48 = 0;
  local_a50 = CoreMLConverter::convertCaffeLRN;
  local_a38 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_a40 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"Softmax","");
  local_a08 = 0;
  local_a10 = CoreMLConverter::convertCaffeSoftmax;
  local_9f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_a00 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_9f0[0] = local_9e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f0,"Pooling","");
  local_9c8 = 0;
  local_9d0 = CoreMLConverter::convertCaffePooling;
  local_9b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_9c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_9b0[0] = local_9a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b0,"Concat","");
  local_988 = 0;
  local_990 = CoreMLConverter::convertCaffeConcat;
  local_978 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_980 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_970[0] = local_960;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_970,"LSTM","");
  local_948 = 0;
  local_950 = CoreMLConverter::convertCaffeLSTM;
  local_938 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_940 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_930[0] = local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"Eltwise","");
  local_908 = 0;
  local_910 = CoreMLConverter::convertCaffeEltwise;
  local_8f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_900 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"Slice","");
  local_8c8 = 0;
  local_8d0 = CoreMLConverter::convertCaffeSlice;
  local_8b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_8c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"Flatten","");
  local_888 = 0;
  local_890 = CoreMLConverter::convertCaffeFlatten;
  local_878 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_880 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"Embed","");
  local_848 = 0;
  local_850 = CoreMLConverter::convertCaffeEmbed;
  local_838 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_840 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"Split","");
  local_808 = 0;
  local_810 = CoreMLConverter::convertCaffeSplit;
  local_7f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_800 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"BatchNorm","");
  local_7c8 = 0;
  local_7d0 = CoreMLConverter::convertCaffeBatchnorm;
  local_7b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_7c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b0,"Input","");
  local_788 = 0;
  local_790 = CoreMLConverter::convertCaffeInputLayers;
  local_778 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_780 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"ImageData","");
  local_748 = 0;
  local_750 = CoreMLConverter::convertCaffeInputLayers;
  local_738 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_740 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"ImageDataMultiLabel","");
  local_708 = 0;
  local_710 = CoreMLConverter::convertCaffeInputLayers;
  local_6f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_700 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f0,"Data","");
  local_6c8 = 0;
  local_6d0 = CoreMLConverter::convertCaffeInputLayers;
  local_6b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_6c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_6b0[0] = local_6a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"HDF5Data","");
  local_688 = 0;
  local_690 = CoreMLConverter::convertCaffeInputLayers;
  local_678 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_680 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_670[0] = local_660;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"WindowData","");
  local_648 = 0;
  local_650 = CoreMLConverter::convertCaffeInputLayers;
  local_638 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_640 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_630[0] = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_630,"MemoryData","");
  local_608 = 0;
  local_610 = CoreMLConverter::convertCaffeInputLayers;
  local_5f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_600 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_5f0[0] = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"DummyData","");
  local_5c8 = 0;
  local_5d0 = CoreMLConverter::convertCaffeInputLayers;
  local_5b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_5c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"HDF5Output","");
  local_588 = 0;
  local_590 = CoreMLConverter::convertCaffeTrainingLayers;
  local_578 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_580 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"Loss","");
  local_548 = 0;
  local_550 = CoreMLConverter::convertCaffeTrainingLayers;
  local_538 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_540 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_530[0] = local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"InfogainLoss","");
  local_508 = 0;
  local_510 = CoreMLConverter::convertCaffeTrainingLayers;
  local_4f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_500 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"EuclideanLoss","");
  local_4c8 = 0;
  local_4d0 = CoreMLConverter::convertCaffeTrainingLayers;
  local_4b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_4c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_4b0[0] = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"Dropout","");
  local_488 = 0;
  local_490 = CoreMLConverter::convertCaffeTrainingLayers;
  local_478 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_480 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"SigmoidCrossEntropyLoss","");
  local_448 = 0;
  local_450 = CoreMLConverter::convertCaffeTrainingLayers;
  local_438 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_440 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"HingeLoss","");
  local_408 = 0;
  local_410 = CoreMLConverter::convertCaffeTrainingLayers;
  local_3f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_400 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"HingeLossMultiLabel","");
  local_3c8 = 0;
  local_3d0 = CoreMLConverter::convertCaffeTrainingLayers;
  local_3b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_3c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"Accuracy","");
  local_388 = 0;
  local_390 = CoreMLConverter::convertCaffeTrainingLayers;
  local_378 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_380 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_370[0] = local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"ContrastiveLoss","");
  local_348 = 0;
  local_350 = CoreMLConverter::convertCaffeTrainingLayers;
  local_338 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_340 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"SoftmaxWithLoss","");
  local_308 = 0;
  local_310 = CoreMLConverter::convertCaffeTrainingLayers;
  local_2f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_300 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"Python","");
  local_2c8 = 0;
  local_2d0 = CoreMLConverter::convertCaffeTrainingLayers;
  local_2b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_2c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Reduction","");
  local_288 = 0;
  local_290 = CoreMLConverter::convertCaffeReduction;
  local_278 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_280 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"Scale","");
  local_248 = 0;
  local_250 = CoreMLConverter::convertCaffeScale;
  local_238 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_240 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Bias","");
  local_208 = 0;
  local_210 = CoreMLConverter::convertCaffeBias;
  local_1f8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"MVN","");
  local_1c8 = 0;
  local_1d0 = CoreMLConverter::convertCaffeMVN;
  local_1b8 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"AbsVal","");
  local_188 = 0;
  local_190 = CoreMLConverter::convertCaffeAbs;
  local_178 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_180 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Exp","");
  local_148 = 0;
  local_150 = CoreMLConverter::convertCaffeExp;
  local_138 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"Power","");
  local_108 = 0;
  local_110 = CoreMLConverter::convertCaffePower;
  local_f8 = std::
             _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
              ::_M_manager;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Log","");
  local_c8 = 0;
  local_d0 = CoreMLConverter::convertCaffeLog;
  local_b8 = std::
             _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
             ::_M_manager;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Crop","");
  local_88 = 0;
  local_90 = CoreMLConverter::convertCaffeCrop;
  local_78 = std::
             _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
             ::_M_manager;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Reshape","");
  local_48 = 0;
  local_50 = CoreMLConverter::convertCaffeReshape;
  local_40[1] = std::
                _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
                ::_M_invoke;
  local_40[0] = std::
                _Function_handler<void_(CoreMLConverter::ConvertLayerParameters),_void_(*)(CoreMLConverter::ConvertLayerParameters)>
                ::_M_manager;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_d28,local_cf0,&stack0xffffffffffffffd0,0,local_d48,&local_d51,&local_d52);
  lVar3 = 0;
  do {
    if (*(code **)((long)local_40 + lVar3) != (code *)0x0) {
      (**(code **)((long)local_40 + lVar3))((long)&local_50 + lVar3,(long)&local_50 + lVar3,3);
    }
    if ((void *)((long)local_60 + lVar3) != *(void **)((long)local_70 + lVar3)) {
      operator_delete(*(void **)((long)local_70 + lVar3),*(long *)((long)local_60 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0xcc0);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_d28,local_d50);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::function<void_(CoreMLConverter::ConvertLayerParameters)>::function
              (__return_storage_ptr__,
               (function<void_(CoreMLConverter::ConvertLayerParameters)> *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_true>
                      ._M_cur + 0x28));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d28);
    return extraout_RAX;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_cf0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_ce0,"Cannot convert caffe layer of type \'",0x24);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_ce0,(local_d50->_M_dataplus)._M_p,local_d50->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'.",2);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_d48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CoreMLConverter::convertCaffeLayerFn
static caffeLayerRegistry(const std::string& layerType) {
    
    const std::unordered_map<std::string, CoreMLConverter::convertCaffeLayerFn> CAFFE_LAYER_REGISTRY {
        {"ReLU", CoreMLConverter::convertCaffeActivation},
        {"BNLL", CoreMLConverter::convertCaffeActivation},
        {"PReLU", CoreMLConverter::convertCaffeActivation},
        {"ELU", CoreMLConverter::convertCaffeActivation},
        {"Sigmoid", CoreMLConverter::convertCaffeActivation},
        {"TanH", CoreMLConverter::convertCaffeActivation},
        {"Parameter", CoreMLConverter::convertCaffeParameter},
        {"InnerProduct", CoreMLConverter::convertCaffeInnnerProduct},
        {"Convolution", CoreMLConverter::convertCaffeConvolution},
        {"Deconvolution", CoreMLConverter::convertCaffeConvolution},
        {"LRN", CoreMLConverter::convertCaffeLRN},
        {"Softmax", CoreMLConverter::convertCaffeSoftmax},
        {"Pooling", CoreMLConverter::convertCaffePooling},
        {"Concat", CoreMLConverter::convertCaffeConcat},
        {"LSTM", CoreMLConverter::convertCaffeLSTM},
        {"Eltwise",CoreMLConverter::convertCaffeEltwise},
        {"Slice",CoreMLConverter::convertCaffeSlice},
        {"Flatten",CoreMLConverter::convertCaffeFlatten},
        {"Embed",CoreMLConverter::convertCaffeEmbed},
        {"Split",CoreMLConverter::convertCaffeSplit},
        {"BatchNorm",CoreMLConverter::convertCaffeBatchnorm},
        {"Input",CoreMLConverter::convertCaffeInputLayers},
        {"ImageData",CoreMLConverter::convertCaffeInputLayers},
        {"ImageDataMultiLabel",CoreMLConverter::convertCaffeInputLayers},
        {"Data",CoreMLConverter::convertCaffeInputLayers},
        {"HDF5Data",CoreMLConverter::convertCaffeInputLayers},
        {"WindowData",CoreMLConverter::convertCaffeInputLayers},
        {"MemoryData",CoreMLConverter::convertCaffeInputLayers},
        {"DummyData",CoreMLConverter::convertCaffeInputLayers},
        {"HDF5Output",CoreMLConverter::convertCaffeTrainingLayers},
        {"Loss",CoreMLConverter::convertCaffeTrainingLayers},
        {"InfogainLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"EuclideanLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"Dropout",CoreMLConverter::convertCaffeTrainingLayers},
        {"SigmoidCrossEntropyLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"HingeLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"HingeLossMultiLabel",CoreMLConverter::convertCaffeTrainingLayers},
        {"Accuracy",CoreMLConverter::convertCaffeTrainingLayers},
        {"ContrastiveLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"SoftmaxWithLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"Python",CoreMLConverter::convertCaffeTrainingLayers},
        {"Reduction",CoreMLConverter::convertCaffeReduction},
        {"Scale",CoreMLConverter::convertCaffeScale},
        {"Bias",CoreMLConverter::convertCaffeBias},
        {"MVN",CoreMLConverter::convertCaffeMVN},
        {"AbsVal",CoreMLConverter::convertCaffeAbs},
        {"Exp",CoreMLConverter::convertCaffeExp},
        {"Power",CoreMLConverter::convertCaffePower},
        {"Log",CoreMLConverter::convertCaffeLog},
        {"Crop",CoreMLConverter::convertCaffeCrop},
        {"Reshape",CoreMLConverter::convertCaffeReshape}
    };
    
    // Find the layer in the global registry.
    const auto& it = CAFFE_LAYER_REGISTRY.find(layerType);
    if (it != CAFFE_LAYER_REGISTRY.end()) {
        return it->second;
        
    // Layer type not supported.
    } else {
        std::stringstream ss;
        ss << "Cannot convert caffe layer of type '" << layerType << "'." << std::endl;
        throw std::runtime_error(ss.str());
    }
}